

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_monster_memory(void)

{
  monster_lore *pmVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  wr_byte('\x02');
  if (z_info->r_max != 0) {
    lVar3 = 10;
    lVar4 = 0x10;
    uVar2 = 0;
    do {
      pmVar1 = l_list;
      if ((*(char **)(r_info->flags + lVar4 + -0x5c) != (char *)0x0) &&
         ((*(short *)(l_list->flags + lVar3 + -0x22) != 0 ||
          (*(short *)(l_list->flags + lVar3 + -0x20) != 0)))) {
        wr_string(*(char **)(r_info->flags + lVar4 + -0x5c));
        wr_u16b(*(uint16_t *)(pmVar1->flags + lVar3 + -0x22));
        wr_u16b(*(uint16_t *)(pmVar1->flags + lVar3 + -0x20));
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x78;
      lVar4 = lVar4 + 0xd0;
    } while (uVar2 < z_info->r_max);
  }
  wr_string("No more monsters");
  return;
}

Assistant:

void wr_monster_memory(void)
{
	int r_idx;

	wr_byte(MFLAG_SIZE);

	for (r_idx = 0; r_idx < z_info->r_max; r_idx++) {
		struct monster_race *race = &r_info[r_idx];
		struct monster_lore *lore = &l_list[r_idx];

		/* Names and kill counts */
		if (!race->name || !(lore->pkills || lore->thefts)) continue;
		wr_string(race->name);
		wr_u16b(lore->pkills);
		wr_u16b(lore->thefts);
	}
	wr_string("No more monsters");
}